

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

bool __thiscall
Omega_h::
CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_impl(CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int *p_argc,char **argv,int i,bool should_print)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool should_print_local;
  int i_local;
  char **argv_local;
  int *p_argc_local;
  CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  bVar1 = parse_arg(argv[i],&this->value_);
  if (bVar1) {
    shift(p_argc,argv,i);
    this_local._7_1_ = true;
  }
  else {
    if (should_print) {
      poVar2 = std::operator<<((ostream *)&std::cout,"could not parse \"");
      poVar2 = std::operator<<(poVar2,argv[i]);
      poVar2 = std::operator<<(poVar2,"\" as type ");
      pcVar3 = ItemTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::name();
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,'\n');
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdLineArg<T>::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  if (!parse_arg(argv[i], &value_)) {
    if (should_print) {
      std::cout << "could not parse \"" << argv[i] << "\" as type "
                << ItemTraits<T>::name() << '\n';
    }
    return false;
  }
  shift(p_argc, argv, i);
  return true;
}